

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::InternalSwap
          (ResizeBilinearLayerParams *this,ResizeBilinearLayerParams *other)

{
  int iVar1;
  SamplingMode *pSVar2;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetsize_,&other->targetsize_);
  pSVar2 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = pSVar2;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void ResizeBilinearLayerParams::InternalSwap(ResizeBilinearLayerParams* other) {
  targetsize_.InternalSwap(&other->targetsize_);
  std::swap(mode_, other->mode_);
  std::swap(_cached_size_, other->_cached_size_);
}